

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O1

double r8_erf(double x)

{
  long lVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dStack_d8;
  double a [5];
  double dStack_a8;
  double q [5];
  double dStack_78;
  double p [6];
  
  dStack_d8 = 3.1611237438705655;
  a[0] = 113.86415415105016;
  a[1] = 377.485237685302;
  a[2] = 3209.3775891384694;
  a[3] = 0.18577770618460315;
  p[0] = 0.36034489994980445;
  p[1] = 0.12578172611122926;
  p[2] = 0.016083785148742275;
  p[3] = 0.0006587491615298378;
  p[4] = 0.016315387137302097;
  q[0] = 1.8729528499234604;
  q[1] = 0.5279051029514285;
  q[2] = 0.06051834131244132;
  q[3] = 0.0023352049762686918;
  dVar6 = ABS(x);
  if (dVar6 <= 0.46875) {
    dVar4 = (double)(-(ulong)(1.11e-16 < dVar6) & (ulong)(x * x));
    dVar6 = dVar4 * 0.18577770618460315;
    lVar2 = 0;
    dVar5 = dVar4;
    do {
      dVar5 = (dVar5 + *(double *)((long)&DAT_002205c0 + lVar2)) * dVar4;
      dVar6 = (dVar6 + *(double *)((long)a + lVar2 + -8)) * dVar4;
      lVar2 = lVar2 + 8;
    } while (lVar2 != 0x18);
    dVar6 = ((dVar6 + 3209.3775891384694) * x) / (dVar5 + 2844.236833439171);
  }
  else {
    if (dVar6 <= 4.0) {
      dVar4 = dVar6 * 2.1531153547440383e-08;
      lVar2 = 0;
      dVar5 = dVar6;
      do {
        dVar4 = (dVar4 + *(double *)((long)&DAT_0022b1a0 + lVar2)) * dVar6;
        dVar5 = (dVar5 + *(double *)((long)&DAT_0022b1f0 + lVar2)) * dVar6;
        lVar2 = lVar2 + 8;
      } while (lVar2 != 0x38);
      dVar5 = (dVar4 + 1230.3393547979972) / (dVar5 + 1230.3393548037495);
    }
    else {
      if (26.543 <= dVar6) {
        return *(double *)(&DAT_0021a860 + (ulong)(0.0 < x) * 8);
      }
      dVar5 = 1.0 / (x * x);
      dVar3 = dVar5 * 0.016315387137302097;
      lVar2 = 0;
      dVar4 = dVar5;
      do {
        lVar1 = lVar2 + -1;
        dVar4 = (dVar4 + q[lVar2 + -1]) * dVar5;
        lVar2 = lVar2 + 1;
        dVar3 = (dVar3 + p[lVar1]) * dVar5;
      } while (lVar2 != 4);
      dVar5 = (0.5641895835477563 -
              (dVar5 * (dVar3 + 0.0006587491615298378)) / (dVar4 + 0.0023352049762686918)) / dVar6;
    }
    dVar3 = (double)(int)(dVar6 * 16.0 * 0.0625);
    p[5] = x;
    dVar4 = exp(-dVar3 * dVar3);
    dVar6 = exp(-(dVar6 - dVar3) * (dVar6 + dVar3));
    dVar6 = (0.5 - dVar6 * dVar4 * dVar5) + 0.5;
    if (p[5] < 0.0) {
      dVar6 = -dVar6;
    }
  }
  return dVar6;
}

Assistant:

BURKHARDT_EXPORT
double r8_erf ( double x )

//****************************************************************************80
//
//  Purpose:
//
//    R8_ERF evaluates the error function ERF(X).
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    24 May 2007
//
//  Author:
//
//    Original FORTRAN77 version by William Cody.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    William Cody,
//    "Rational Chebyshev approximations for the error function",
//    Mathematics of Computation, 
//    1969, pages 631-638.
//
//  Parameters:
//
//    Input, double X, the argument of the error function.
//
//    Output, double R8_ERF, the value of the error function.
//
{
  double a[5] = {
    3.16112374387056560, 
    1.13864154151050156E+02, 
    3.77485237685302021E+02, 
    3.20937758913846947E+03, 
    1.85777706184603153E-01 };
  double b[4] = {
    2.36012909523441209E+01, 
    2.44024637934444173E+02, 
    1.28261652607737228E+03, 
    2.84423683343917062E+03 };
  double c[9] = {
    5.64188496988670089E-01, 
    8.88314979438837594, 
    6.61191906371416295E+01, 
    2.98635138197400131E+02, 
    8.81952221241769090E+02, 
    1.71204761263407058E+03, 
    2.05107837782607147E+03, 
    1.23033935479799725E+03, 
    2.15311535474403846E-08 };
  double d[8] = {
    1.57449261107098347E+01, 
    1.17693950891312499E+02, 
    5.37181101862009858E+02, 
    1.62138957456669019E+03, 
    3.29079923573345963E+03, 
    4.36261909014324716E+03, 
    3.43936767414372164E+03, 
    1.23033935480374942E+03 };
  double del;
  double erfx;
  int i;
  double p[6] = {
    3.05326634961232344E-01, 
    3.60344899949804439E-01, 
    1.25781726111229246E-01, 
    1.60837851487422766E-02, 
    6.58749161529837803E-04, 
    1.63153871373020978E-02 };
  double q[5] = {
    2.56852019228982242, 
    1.87295284992346047, 
    5.27905102951428412E-01, 
    6.05183413124413191E-02, 
    2.33520497626869185E-03 };
  double sqrpi = 0.56418958354775628695;
  double thresh = 0.46875;
  double xbig = 26.543;
  double xabs;
  double xden;
  double xnum;
  double xsmall = 1.11E-16;
  double xsq;

  xabs = fabs ( x );
//
//  Evaluate ERF(X) for |X| <= 0.46875.
//
  if ( xabs <= thresh )
  {
    if ( xsmall < xabs )
    {
      xsq = xabs * xabs;
    }
    else
    {
      xsq = 0.0;
    }

    xnum = a[4] * xsq;
    xden = xsq;
    for ( i = 0; i < 3; i++ )
    {
      xnum = ( xnum + a[i] ) * xsq;
      xden = ( xden + b[i] ) * xsq;
    }

    erfx = x * ( xnum + a[3] ) / ( xden + b[3] );
  }
//
//  Evaluate ERFC(X) for 0.46875 <= |X| <= 4.0.
//
  else if ( xabs <= 4.0 )
  {
    xnum = c[8] * xabs;
    xden = xabs;
    for ( i = 0; i < 7; i++ )
    {
      xnum = ( xnum + c[i] ) * xabs;
      xden = ( xden + d[i] ) * xabs;
    }

    erfx = ( xnum + c[7] ) / ( xden + d[7] );
    xsq = double(int( ( xabs * 16.0 ) / 16.0 ));
    del = ( xabs - xsq ) * ( xabs + xsq );
    erfx = exp ( - xsq * xsq ) * exp ( - del ) * erfx;

    erfx = ( 0.5 - erfx ) + 0.5;

    if ( x < 0.0 )
    {
      erfx = - erfx;
    }
  }
//
//  Evaluate ERFC(X) for 4.0 < |X|.
//
  else
  {
    if ( xbig <= xabs )
    {
      if ( 0.0 < x )
      {
        erfx = 1.0;
      }
      else
      {
        erfx = - 1.0;
      }
    }
    else
    {
      xsq = 1.0 / ( xabs * xabs );

      xnum = p[5] * xsq;
      xden = xsq;
      for ( i = 0; i < 4; i++ )
      {
        xnum = ( xnum + p[i] ) * xsq;
        xden = ( xden + q[i] ) * xsq;
      }

      erfx = xsq * ( xnum + p[4] ) / ( xden + q[4] );
      erfx = ( sqrpi - erfx ) / xabs;
      xsq = double(int( ( xabs * 16.0 ) / 16.0 ));
      del = ( xabs - xsq ) * ( xabs + xsq );
      erfx = exp ( - xsq * xsq ) * exp ( - del ) * erfx;

      erfx = ( 0.5 - erfx ) + 0.5;
      if ( x < 0.0 )
      {
        erfx = - erfx;
      }

    }

  }

  return erfx;
}